

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Definition * __thiscall cppforth::Forth::getDefinition(Forth *this,Cell index)

{
  size_type sVar1;
  reference pvVar2;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_14;
  Forth *pFStack_10;
  Cell index_local;
  Forth *this_local;
  
  local_14 = index;
  pFStack_10 = this;
  sVar1 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
          size(&this->definitions);
  if (sVar1 <= index) {
    std::__cxx11::to_string(&local_58,local_14);
    std::operator+(&local_38,"Access to definitions out of range ",&local_58);
    throwCppExceptionMessage(this,&local_38,errorUndefinedWord);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pvVar2 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
           operator[](&this->definitions,(ulong)local_14);
  return pvVar2;
}

Assistant:

Definition *getDefinition(Cell index){
			if ((index < 0) || (index >= definitions.size())){
					throwCppExceptionMessage("Access to definitions out of range "+std::to_string(index),errorUndefinedWord);
			}
			return &definitions[index];
		}